

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cc
# Opt level: O0

char flow::signatureType(LiteralType t)

{
  char local_9;
  LiteralType t_local;
  
  switch(t) {
  case Void:
    local_9 = 'V';
    break;
  case Boolean:
    local_9 = 'B';
    break;
  case Number:
    local_9 = 'I';
    break;
  case String:
    local_9 = 'S';
    break;
  default:
    abort();
  case IPAddress:
    local_9 = 'P';
    break;
  case Cidr:
    local_9 = 'C';
    break;
  case RegExp:
    local_9 = 'R';
    break;
  case Handler:
    local_9 = 'H';
    break;
  case IntArray:
    local_9 = 'i';
    break;
  case StringArray:
    local_9 = 's';
    break;
  case IPAddrArray:
    local_9 = 'p';
    break;
  case CidrArray:
    local_9 = 'c';
  }
  return local_9;
}

Assistant:

char signatureType(LiteralType t) {
  switch (t) {
    case LiteralType::Void:
      return 'V';
    case LiteralType::Boolean:
      return 'B';
    case LiteralType::Number:
      return 'I';
    case LiteralType::String:
      return 'S';
    case LiteralType::IPAddress:
      return 'P';
    case LiteralType::Cidr:
      return 'C';
    case LiteralType::RegExp:
      return 'R';
    case LiteralType::Handler:
      return 'H';
    case LiteralType::StringArray:
      return 's';
    case LiteralType::IntArray:
      return 'i';
    case LiteralType::IPAddrArray:
      return 'p';
    case LiteralType::CidrArray:
      return 'c';
    default:
      abort();
      return '?';
  }
}